

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  uint *workSpace_00;
  void *dst_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  S16 norm [256];
  U32 count [256];
  uint local_65c;
  void *local_658;
  ulong local_650;
  uint *local_648;
  ulong local_640;
  short local_638 [256];
  uint local_438 [258];
  
  iVar1 = 1 << ((char)tableLog - 1U & 0x1f);
  iVar6 = 0x400;
  if (0xc < tableLog) {
    iVar6 = 1 << ((char)tableLog - 2U & 0x1f);
  }
  if (wkspSize < iVar6 + iVar1 + maxSymbolValue * 2 + 3) {
    return 0xfffffffffffffffb;
  }
  if (1 < srcSize) {
    local_640 = (ulong)(iVar1 + maxSymbolValue * 2 + 3);
    workSpace_00 = (uint *)((long)workSpace + local_640 * 4);
    local_65c = maxSymbolValue;
    if (maxSymbolValue == 0) {
      local_65c = 0xff;
    }
    uVar9 = 0xb;
    if (tableLog != 0) {
      uVar9 = tableLog;
    }
    local_658 = dst;
    sVar4 = HIST_count_wksp(local_438,&local_65c,src,srcSize,workSpace_00);
    if (0xfffffffffffffff7 < sVar4) {
      return sVar4;
    }
    if (sVar4 == srcSize) {
      return 1;
    }
    local_650 = srcSize >> 7;
    if (local_650 <= sVar4 && sVar4 != 1) {
      uVar2 = (int)srcSize - 1;
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar2 = 0x1d - (uVar3 ^ 0x1f);
      uVar7 = 0x20 - (uVar3 ^ 0x1f);
      uVar3 = 0x1f;
      if (local_65c != 0) {
        for (; local_65c >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uVar3 ^ 0xffffffe0) + 0x22;
      if (uVar7 < uVar3) {
        uVar3 = uVar7;
      }
      if (uVar9 <= uVar2) {
        uVar2 = uVar9;
      }
      if (uVar2 < uVar3) {
        uVar2 = uVar3;
      }
      uVar9 = 5;
      if (5 < uVar2) {
        uVar9 = uVar2;
      }
      uVar3 = 0xc;
      if (uVar9 < 0xc) {
        uVar3 = uVar9;
      }
      local_648 = workSpace_00;
      sVar4 = FSE_normalizeCount(local_638,uVar3,local_438,srcSize,local_65c);
      if (0xfffffffffffffff7 < sVar4) {
        return sVar4;
      }
      sVar4 = FSE_writeNCount(local_658,dstSize,local_638,local_65c,uVar3);
      if (0xfffffffffffffff7 < sVar4) {
        return sVar4;
      }
      sVar5 = FSE_buildCTable_wksp
                        ((FSE_CTable *)workSpace,local_638,local_65c,uVar3,local_648,
                         wkspSize + local_640 * -4);
      if (0xfffffffffffffff7 < sVar5) {
        return sVar5;
      }
      dst_00 = (void *)((long)local_658 + sVar4);
      sVar4 = FSE_compress_usingCTable_generic
                        (dst_00,dstSize - sVar4,src,srcSize,(FSE_CTable *)workSpace,
                         (uint)(local_650 + srcSize <= dstSize - sVar4));
      if (0xfffffffffffffff7 < sVar4) {
        return sVar4;
      }
      if (sVar4 != 0) {
        uVar8 = (long)dst_00 + (sVar4 - (long)local_658);
        if (srcSize - 1 <= uVar8) {
          return 0;
        }
        return uVar8;
      }
    }
  }
  return 0;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32   count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, (unsigned*)scratchBuffer) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}